

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

CFGNode * __thiscall
dxil_spv::CFGStructurizer::create_helper_succ_block(CFGStructurizer *this,CFGNode *node)

{
  uint32_t uVar1;
  CFGNode *new_node;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_40;
  
  new_node = CFGNodePool::create_node(this->pool);
  std::operator+(&local_40,&node->name,".succ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&new_node->name,&local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose(&local_40);
  uVar1 = node->backward_post_visit_order;
  new_node->forward_post_visit_order = node->forward_post_visit_order;
  new_node->backward_post_visit_order = uVar1;
  std::_Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
  _Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&new_node->succ,(_Vector_impl_data *)&node->succ);
  new_node->immediate_post_dominator = node->immediate_post_dominator;
  node->immediate_post_dominator = new_node;
  Terminator::operator=(&(new_node->ir).terminator,&(node->ir).terminator);
  (node->ir).terminator.type = Branch;
  (node->ir).terminator.direct_block = new_node;
  if ((new_node->ir).terminator.type == Condition) {
    (new_node->ir).merge_info.selection_control_mask = (node->ir).merge_info.selection_control_mask;
  }
  retarget_succ_from(this,new_node,node);
  CFGNode::add_branch(node,new_node);
  return new_node;
}

Assistant:

CFGNode *CFGStructurizer::create_helper_succ_block(CFGNode *node)
{
	auto *succ_node = pool.create_node();
	succ_node->name = node->name + ".succ";

	// Fixup visit order later.
	succ_node->forward_post_visit_order = node->forward_post_visit_order;
	succ_node->backward_post_visit_order = node->backward_post_visit_order;

	std::swap(succ_node->succ, node->succ);
	// Do not swap back edges, only forward edges.

	succ_node->immediate_post_dominator = node->immediate_post_dominator;
	node->immediate_post_dominator = succ_node;

	succ_node->ir.terminator = node->ir.terminator;
	node->ir.terminator.type = Terminator::Type::Branch;
	node->ir.terminator.direct_block = succ_node;

	// Inherit selection construct from parent since we're taking over any selection.
	if (succ_node->ir.terminator.type == Terminator::Type::Condition)
		succ_node->ir.merge_info.selection_control_mask = node->ir.merge_info.selection_control_mask;

	retarget_succ_from(succ_node, node);

	node->add_branch(succ_node);
	return succ_node;
}